

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O2

void __thiscall wasm::ShellExternalInterface::Memory::resize(Memory *this,size_t newSize)

{
  pointer pcVar1;
  pointer pcVar2;
  size_type __new_size;
  
  pcVar1 = (this->memory).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar2 = (this->memory).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = 0x1000;
  if (0x1000 < newSize) {
    __new_size = newSize;
  }
  std::vector<char,_std::allocator<char>_>::resize(&this->memory,__new_size);
  if ((newSize < 0x1000) && (newSize < (ulong)((long)pcVar1 - (long)pcVar2))) {
    memset((this->memory).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + newSize,0,0x1000 - newSize);
    return;
  }
  return;
}

Assistant:

void resize(size_t newSize) {
      // Ensure the smallest allocation is large enough that most allocators
      // will provide page-aligned storage. This hopefully allows the
      // interpreter's memory to be as aligned as the memory being simulated,
      // ensuring that the performance doesn't needlessly degrade.
      //
      // The code is optimistic this will work until WG21's p0035r0 happens.
      const size_t minSize = 1 << 12;
      size_t oldSize = memory.size();
      memory.resize(std::max(minSize, newSize));
      if (newSize < oldSize && newSize < minSize) {
        std::memset(&memory[newSize], 0, minSize - newSize);
      }
    }